

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O0

int av1_get_skip_txfm_context(MACROBLOCKD *xd)

{
  uint local_28;
  uint local_24;
  int left_skip_txfm;
  int above_skip_txfm;
  MB_MODE_INFO *left_mi;
  MB_MODE_INFO *above_mi;
  MACROBLOCKD *xd_local;
  
  if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
    local_24 = 0;
  }
  else {
    local_24 = (uint)xd->above_mbmi->skip_txfm;
  }
  if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
    local_28 = 0;
  }
  else {
    local_28 = (uint)xd->left_mbmi->skip_txfm;
  }
  return local_24 + local_28;
}

Assistant:

static inline int av1_get_skip_txfm_context(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  const int above_skip_txfm = above_mi ? above_mi->skip_txfm : 0;
  const int left_skip_txfm = left_mi ? left_mi->skip_txfm : 0;
  return above_skip_txfm + left_skip_txfm;
}